

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImputerValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)601>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FeatureDescription *pFVar2;
  void *pvVar3;
  long lVar4;
  bool bVar5;
  LogMessage *pLVar6;
  FeatureType *pFVar7;
  long *plVar8;
  ArrayFeatureType *pAVar9;
  Imputer *pIVar10;
  DoubleVector *pDVar11;
  undefined8 *puVar12;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *interface;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_04;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_05;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_06;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_07;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_08;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_09;
  initializer_list<CoreML::Specification::Imputer::ReplaceValueCase> __l_10;
  Result result;
  anon_class_24_3_489072cd checkInterfaceCompatible;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  possible_types;
  allocator_type local_174;
  allocator_type local_173;
  less<CoreML::Specification::Imputer::ReplaceValueCase> local_172;
  allocator_type local_171;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  ReplaceValueCase local_144;
  undefined1 local_140 [48];
  TypeCase local_110 [2];
  _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  local_108;
  anon_class_24_3_489072cd local_d8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c0;
  undefined1 local_a8 [8];
  _Alloc_hider _Stack_a0;
  int local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  LogMessage local_68;
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)local_170);
  validateModelDescription((Result *)local_a8,interface,format->specificationversion_);
  local_170 = local_a8;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&_Stack_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_a0._M_p != local_90) {
    operator_delete(_Stack_a0._M_p,local_90[0]._M_allocated_capacity + 1);
  }
  bVar5 = Result::good((Result *)local_170);
  if (!bVar5) {
    __return_storage_ptr__->m_type = local_170._0_4_;
    __return_storage_ptr__->m_reason = local_170._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p == &local_158) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_158._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_168._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_160;
    local_160 = 0;
    local_158._M_local_buf[0] = '\0';
    local_168._M_p = (pointer)&local_158;
    goto LAB_002755ec;
  }
  local_a8 = (undefined1  [8])0x200000001;
  _Stack_a0._M_p = (pointer)0x300000005;
  local_98 = 6;
  __l._M_len = 5;
  __l._M_array = (iterator)local_a8;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&local_c0,__l,(allocator_type *)&local_68);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_a8,(CoreML *)&interface->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_c0,in_R8
            );
  local_170 = local_a8;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&_Stack_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_a0._M_p != local_90) {
    operator_delete(_Stack_a0._M_p,local_90[0]._M_allocated_capacity + 1);
  }
  bVar5 = Result::good((Result *)local_170);
  if (!bVar5) goto switchD_002752c3_default;
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_a8,(CoreML *)&interface->output_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_c0,in_R8
            );
  local_170 = local_a8;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&_Stack_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_a0._M_p != local_90) {
    operator_delete(_Stack_a0._M_p,local_90[0]._M_allocated_capacity + 1);
  }
  bVar5 = Result::good((Result *)local_170);
  if (!bVar5) goto switchD_002752c3_default;
  if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar6 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar6);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  pFVar2 = (FeatureDescription *)((interface->input_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar6 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_a8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_140,pLVar6);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
  }
  pvVar3 = ((interface->output_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  puVar12 = *(undefined8 **)((long)pvVar3 + 0x20);
  if (puVar12 == (undefined8 *)0x0) {
    puVar12 = &Specification::_FeatureType_default_instance_;
  }
  pFVar7 = pFVar2->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  if (*(uint32 *)((long)puVar12 + 0x24) != pFVar7->_oneof_case_[0]) {
    local_140._0_8_ = local_140 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_140,"Type of input feature does not match the output type feature.",
               "");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_140);
LAB_002751a9:
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    goto LAB_002755cf;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    if (((pFVar7->Type_).int64type_)->_cached_size_ == 1) {
      puVar12 = *(undefined8 **)((long)pvVar3 + 0x20);
      if (puVar12 == (undefined8 *)0x0) {
        puVar12 = &Specification::_FeatureType_default_instance_;
      }
      if (*(int *)((long)puVar12 + 0x24) == 5) {
        pAVar9 = (ArrayFeatureType *)puVar12[3];
      }
      else {
        pAVar9 = Specification::ArrayFeatureType::default_instance();
      }
      if ((pAVar9->shape_).current_size_ == 1) {
        pFVar7 = pFVar2->type_;
        if (pFVar7 == (FeatureType *)0x0) {
          pFVar7 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if (pFVar7->_oneof_case_[0] == 5) {
          pAVar9 = (pFVar7->Type_).multiarraytype_;
        }
        else {
          pAVar9 = Specification::ArrayFeatureType::default_instance();
        }
        plVar8 = google::protobuf::RepeatedField<long>::Get(&pAVar9->shape_,0);
        puVar12 = *(undefined8 **)((long)pvVar3 + 0x20);
        if (puVar12 == (undefined8 *)0x0) {
          puVar12 = &Specification::_FeatureType_default_instance_;
        }
        lVar4 = *plVar8;
        if (*(int *)((long)puVar12 + 0x24) == 5) {
          pAVar9 = (ArrayFeatureType *)puVar12[3];
        }
        else {
          pAVar9 = Specification::ArrayFeatureType::default_instance();
        }
        plVar8 = google::protobuf::RepeatedField<long>::Get(&pAVar9->shape_,0);
        if (lVar4 == *plVar8) goto LAB_00275277;
      }
      local_140._0_8_ = local_140 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_140,"Shape of output array does not match shape of input array.",""
                );
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_140);
    }
    else {
      local_140._0_8_ = local_140 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_140,
                 "Only 1 dimensional arrays input features are supported by the imputer.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_140);
    }
    goto LAB_002751a9;
  }
LAB_00275277:
  local_d8.input = pFVar2;
  local_d8.result = (Result *)local_170;
  local_d8.format = format;
  if (format->_oneof_case_[0] == 0x259) {
    pIVar10 = (format->Type_).imputer_;
  }
  else {
    pIVar10 = Specification::Imputer::default_instance();
  }
  switch(pIVar10->_oneof_case_[0]) {
  case 0:
    local_140._0_8_ = local_140 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_140,"Imputer parameter must be set.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_140);
    goto LAB_002751a9;
  case 1:
    local_110[0] = kDoubleType;
    local_110[1] = kMultiArrayType;
    __l_07._M_len = 2;
    __l_07._M_array = local_110;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_140,__l_07,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_174,
          &local_171);
    local_144 = kReplaceDoubleValue;
    __l_08._M_len = 1;
    __l_08._M_array = &local_144;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_108,__l_08,&local_172,&local_173);
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&local_d8,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_140,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_108);
    break;
  case 2:
    local_110[0] = 1;
    __l_03._M_len = 1;
    __l_03._M_array = local_110;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_140,__l_03,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_174,
          &local_171);
    local_144 = kReplaceInt64Value;
    __l_04._M_len = 1;
    __l_04._M_array = &local_144;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_108,__l_04,&local_172,&local_173);
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&local_d8,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_140,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_108);
    break;
  case 3:
    local_110[0] = 3;
    __l_05._M_len = 1;
    __l_05._M_array = local_110;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_140,__l_05,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_174,
          &local_171);
    local_144 = kReplaceStringValue;
    __l_06._M_len = 1;
    __l_06._M_array = &local_144;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_108,__l_06,&local_172,&local_173);
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&local_d8,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_140,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_108);
    break;
  case 4:
    local_110[0] = 5;
    __l_01._M_len = 1;
    __l_01._M_array = local_110;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_140,__l_01,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_174,
          &local_171);
    local_144 = kReplaceDoubleValue;
    __l_02._M_len = 1;
    __l_02._M_array = &local_144;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_108,__l_02,&local_172,&local_173);
    bVar5 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                      (&local_d8,
                       (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        *)local_140,
                       (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                        *)&local_108);
    std::
    _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::~_Rb_tree(&local_108);
    std::
    _Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Rb_tree((_Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 *)local_140);
    if (bVar5) {
      pFVar7 = pFVar2->type_;
      if (pFVar7 == (FeatureType *)0x0) {
        pFVar7 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if (pFVar7->_oneof_case_[0] == 5) {
        pAVar9 = (pFVar7->Type_).multiarraytype_;
      }
      else {
        pAVar9 = Specification::ArrayFeatureType::default_instance();
      }
      plVar8 = google::protobuf::RepeatedField<long>::Get(&pAVar9->shape_,0);
      lVar4 = *plVar8;
      if (pIVar10->_oneof_case_[0] == 4) {
        pDVar11 = (pIVar10->ImputedValue_).imputeddoublearray_;
      }
      else {
        pDVar11 = Specification::DoubleVector::default_instance();
      }
      if (lVar4 != (pDVar11->vector_).current_size_) {
        local_140._0_8_ = local_140 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_140,
                   "Shape of imputed array value does not match shape of input array.","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_140);
        goto LAB_002751a9;
      }
    }
    goto switchD_002752c3_default;
  case 5:
    local_110[0] = 5;
    __l_09._M_len = 1;
    __l_09._M_array = local_110;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_140,__l_09,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_174,
          &local_171);
    local_144 = kReplaceInt64Value;
    __l_10._M_len = 1;
    __l_10._M_array = &local_144;
    std::
    set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::set((set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
           *)&local_108,__l_10,&local_172,&local_173);
    bVar5 = validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
                      (&local_d8,
                       (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        *)local_140,
                       (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                        *)&local_108);
    std::
    _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
    ::~_Rb_tree(&local_108);
    std::
    _Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Rb_tree((_Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 *)local_140);
    if (bVar5) {
      pFVar7 = pFVar2->type_;
      if (pFVar7 == (FeatureType *)0x0) {
        pFVar7 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if (pFVar7->_oneof_case_[0] == 5) {
        pAVar9 = (pFVar7->Type_).multiarraytype_;
      }
      else {
        pAVar9 = Specification::ArrayFeatureType::default_instance();
      }
      plVar8 = google::protobuf::RepeatedField<long>::Get(&pAVar9->shape_,0);
      lVar4 = *plVar8;
      if (pIVar10->_oneof_case_[0] == 5) {
        pDVar11 = (pIVar10->ImputedValue_).imputeddoublearray_;
      }
      else {
        pDVar11 = (DoubleVector *)Specification::Int64Vector::default_instance();
      }
      if (lVar4 != (pDVar11->vector_).current_size_) {
        local_140._0_8_ = local_140 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_140,
                   "Shape of imputed array value does not match shape of input array.","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_140);
        goto LAB_002751a9;
      }
    }
    goto switchD_002752c3_default;
  case 6:
  case 7:
    local_110[0] = 6;
    __l_00._M_len = 1;
    __l_00._M_array = local_110;
    std::
    set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::set((set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           *)local_140,__l_00,(less<CoreML::Specification::FeatureType::TypeCase> *)&local_144,
          &local_174);
    local_108._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_108._M_impl.super__Rb_tree_header._M_header;
    local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_108._M_impl._0_8_ = 0;
    local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_108._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_108._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_108._M_impl.super__Rb_tree_header._M_header._M_right =
         local_108._M_impl.super__Rb_tree_header._M_header._M_left;
    validate<(MLModelType)601>::anon_class_24_3_489072cd::operator()
              (&local_d8,
               (set<CoreML::Specification::FeatureType::TypeCase,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_140,
               (set<CoreML::Specification::Imputer::ReplaceValueCase,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
                *)&local_108);
    break;
  default:
    goto switchD_002752c3_default;
  }
  std::
  _Rb_tree<CoreML::Specification::Imputer::ReplaceValueCase,_CoreML::Specification::Imputer::ReplaceValueCase,_std::_Identity<CoreML::Specification::Imputer::ReplaceValueCase>,_std::less<CoreML::Specification::Imputer::ReplaceValueCase>,_std::allocator<CoreML::Specification::Imputer::ReplaceValueCase>_>
  ::~_Rb_tree(&local_108);
  std::
  _Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Rb_tree((_Rb_tree<CoreML::Specification::FeatureType::TypeCase,_CoreML::Specification::FeatureType::TypeCase,_std::_Identity<CoreML::Specification::FeatureType::TypeCase>,_std::less<CoreML::Specification::FeatureType::TypeCase>,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               *)local_140);
switchD_002752c3_default:
  __return_storage_ptr__->m_type = local_170._0_4_;
  __return_storage_ptr__->m_reason = local_170._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p == &local_158) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_158._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_168._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_160;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  local_168._M_p = (pointer)&local_158;
LAB_002755cf:
  if (local_c0.
      super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_002755ec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,
                    CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_imputer>(const Specification::Model& format) {
        const auto& description = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;
        
        
        std::vector<Specification::FeatureType::TypeCase> possible_types = {
            FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType,
            FT::kStringType, FT::kDictionaryType};
        
        // Validate the inputs, though we'll have to do more of this manually.
        result = validateDescriptionsContainFeatureWithTypes(description.input(), 1, possible_types);
        
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(description.output(), 1, possible_types);
        
        if (!result.good()) {
            return result;
        }
        
            // From the above, we know that we have exactly one input and one output type.
        const auto& input = description.input()[0];
        const auto& output = description.output()[0];
        
        // make sure the input and the output match.
        if(output.type().Type_case() != input.type().Type_case()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Type of input feature does not match the output type feature.");
        }
        
        // If it's an array, we need to test sizes.
        if(input.type().Type_case() == FT::kMultiArrayType) {
            if(input.type().multiarraytype().shape_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                "Only 1 dimensional arrays input features are supported by the imputer.");
            }
            
            if(output.type().multiarraytype().shape_size() != 1
               || (input.type().multiarraytype().shape(0) != output.type().multiarraytype().shape(0))) {
                return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                "Shape of output array does not match shape of input array.");
            }
        }
        
           
        // Input and output types are allowed based on the values present in the
        auto checkInterfaceCompatible =
        [&](const std::set<Specification::FeatureType::TypeCase>& compatibleFeatureTypes,
            const std::set<Specification::Imputer::ReplaceValueCase>& compatibleReplaceTypes) {
            
            if(!compatibleFeatureTypes.count(input.type().Type_case())) {
                result = Result(ResultType::INVALID_MODEL_PARAMETERS,
                       "Type of input feature \"" + input.name() + "\" is not compatible with given imputed value type.");
                return false;
            }
            
            
            // Check to make sure the the replace value is fine
            if(format.imputer().ReplaceValue_case() != Specification::Imputer::REPLACEVALUE_NOT_SET) {
                if(!compatibleReplaceTypes.count(format.imputer().ReplaceValue_case())) {
                    result = Result(ResultType::INVALID_MODEL_PARAMETERS,
                                    "Type of given replace value not compatible with input feature type.");
                    return false;
                }
            }
            
            // We're all okay now.
            return true;
        };
               
        // Validate the different combinations of stuff.
        const auto& imputer = format.imputer();
        switch (imputer.ImputedValue_case()) {
            case Specification::Imputer::kImputedDoubleValue:
                if(!checkInterfaceCompatible({FT::kDoubleType, FT::kMultiArrayType}, {RVC::kReplaceDoubleValue})) {
                        return result;
                    }
                break;
                
            case Specification::Imputer::kImputedInt64Value:
                if(!checkInterfaceCompatible({FT::kInt64Type}, {RVC::kReplaceInt64Value})) {
                        return result;
                    }
                break;
            case Specification::Imputer::kImputedDoubleArray:
                if(!checkInterfaceCompatible({FT::kMultiArrayType}, {RVC::kReplaceDoubleValue})) {
                    return result;
                }
                
                    // Check to make sure the array sizes match
                if(input.type().multiarraytype().shape(0) != static_cast<int64_t>(imputer.imputeddoublearray().vector_size())) {
                    return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                   "Shape of imputed array value does not match shape of input array.");
                }
                
                break;
            case Specification::Imputer::kImputedStringValue:
                if(!checkInterfaceCompatible({FT::kStringType}, {RVC::kReplaceStringValue})) {
                    return result;
                }
                break;
                    
            case Specification::Imputer::kImputedInt64Array:
                if(!checkInterfaceCompatible({FT::kMultiArrayType}, {RVC::kReplaceInt64Value})) {
                    return result;
                }
                
                    // Check to make sure the array sizes match
                if(input.type().multiarraytype().shape(0) != static_cast<int64_t>(imputer.imputedint64array().vector_size())) {
                    return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                                   "Shape of imputed array value does not match shape of input array.");
                }
                break;
                    
            case Specification::Imputer::kImputedStringDictionary:
            case Specification::Imputer::kImputedInt64Dictionary:
                    // This only works with a full on ungiven replacement value.
                if(!checkInterfaceCompatible({FT::kDictionaryType}, {})) {
                    return result;
                }
                break;
                    
            case Specification::Imputer::IMPUTEDVALUE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Imputer parameter must be set.");
                break;
        }

        return result;
    }